

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PMFData.H
# Opt level: O1

void __thiscall pele::physics::PMF::PmfData::initialize(PmfData *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  Real *pRVar2;
  uint uVar3;
  uint uVar4;
  undefined4 uVar5;
  bool bVar6;
  int iVar7;
  Arena *pAVar8;
  undefined4 extraout_var;
  string datafile;
  int do_average;
  ParmParse pp;
  string local_90;
  int local_6c;
  ParmParse local_68;
  DataContainer *pDVar9;
  
  paVar1 = &local_90.field_2;
  local_90._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_90,"pmf","");
  amrex::ParmParse::ParmParse(&local_68,&local_90);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90._M_dataplus._M_p != paVar1) {
    operator_delete(local_90._M_dataplus._M_p,
                    CONCAT71(local_90.field_2._M_allocated_capacity._1_7_,
                             local_90.field_2._M_local_buf[0]) + 1);
  }
  local_90._M_string_length = 0;
  local_90.field_2._M_local_buf[0] = '\0';
  local_90._M_dataplus._M_p = (pointer)paVar1;
  amrex::ParmParse::query(&local_68,"v",&this->m_verbose,0);
  local_6c = 1;
  amrex::ParmParse::query(&local_68,"do_cellAverage",&local_6c,0);
  bVar6 = amrex::ParmParse::contains(&local_68,"datafile");
  if (!bVar6) {
    amrex::Abort_host("pmf.datafile is required when using pmf");
  }
  amrex::ParmParse::get(&local_68,"datafile",&local_90,0);
  read_pmf(this,&local_90,local_6c,this->m_verbose);
  if (this->m_device_allocated == false) {
    pAVar8 = amrex::The_Arena();
    iVar7 = (*pAVar8->_vptr_Arena[2])(pAVar8,0x20);
    pDVar9 = (DataContainer *)CONCAT44(extraout_var,iVar7);
    this->m_data_d = pDVar9;
    this->m_device_allocated = true;
    uVar3 = (this->m_data_h).m_nPoint;
    uVar4 = (this->m_data_h).m_nVar;
    iVar7 = (this->m_data_h).m_doAverage;
    uVar5 = *(undefined4 *)&(this->m_data_h).field_0xc;
    pRVar2 = (this->m_data_h).pmf_Y;
    pDVar9->pmf_X = (this->m_data_h).pmf_X;
    pDVar9->pmf_Y = pRVar2;
    pDVar9->m_nPoint = uVar3;
    pDVar9->m_nVar = uVar4;
    pDVar9->m_doAverage = iVar7;
    *(undefined4 *)&pDVar9->field_0xc = uVar5;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90._M_dataplus._M_p != paVar1) {
    operator_delete(local_90._M_dataplus._M_p,
                    CONCAT71(local_90.field_2._M_allocated_capacity._1_7_,
                             local_90.field_2._M_local_buf[0]) + 1);
  }
  std::
  deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~deque((deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)&local_68);
  return;
}

Assistant:

void initialize()
  {
    amrex::ParmParse pp("pmf");
    std::string datafile;
    pp.query("v", m_verbose);
    int do_average = 1;
    pp.query("do_cellAverage", do_average);
    if (!pp.contains("datafile")) {
      amrex::Abort("pmf.datafile is required when using pmf");
    }
    pp.get("datafile", datafile);
    read_pmf(datafile, do_average, m_verbose);
    allocate();
  }